

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

uint32_t av1_get_crc_value(CRC_CALCULATOR *p_crc_calculator,uint8_t *p,int length)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  
  p_crc_calculator->remainder = 0;
  if (length != 0) {
    uVar2 = 0;
    uVar3 = 0;
    do {
      bVar1 = p[uVar2];
      p_crc_calculator->remainder = uVar3 << 8;
      uVar3 = uVar3 << 8 ^
              p_crc_calculator->table
              [(byte)((byte)(uVar3 >> ((char)p_crc_calculator->bits - 8U & 0x1f)) ^ bVar1)];
      p_crc_calculator->remainder = uVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)length != uVar2);
  }
  return p_crc_calculator->final_result_mask & p_crc_calculator->remainder;
}

Assistant:

uint32_t av1_get_crc_value(CRC_CALCULATOR *p_crc_calculator, uint8_t *p,
                           int length) {
  crc_calculator_reset(p_crc_calculator);
  crc_calculator_process_data(p_crc_calculator, p, length);
  return crc_calculator_get_crc(p_crc_calculator);
}